

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

_Bool isKnownKeyValueString(char *key)

{
  int iVar1;
  char *in_RDI;
  _Bool local_1;
  
  iVar1 = strcmp(in_RDI,"KTXorientation");
  if (iVar1 == 0) {
    local_1 = true;
  }
  else {
    iVar1 = strcmp(in_RDI,"KTXswizzle");
    if (iVar1 == 0) {
      local_1 = true;
    }
    else {
      iVar1 = strcmp(in_RDI,"KTXwriter");
      if (iVar1 == 0) {
        local_1 = true;
      }
      else {
        iVar1 = strcmp(in_RDI,"KTXwriterScParams");
        if (iVar1 == 0) {
          local_1 = true;
        }
        else {
          iVar1 = strcmp(in_RDI,"KTXastcDecodeMode");
          if (iVar1 == 0) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool isKnownKeyValueString(const char* key) {
    if (strcmp(key, "KTXorientation") == 0)
        return true;
    if (strcmp(key, "KTXswizzle") == 0)
        return true;
    if (strcmp(key, "KTXwriter") == 0)
        return true;
    if (strcmp(key, "KTXwriterScParams") == 0)
        return true;
    if (strcmp(key, "KTXastcDecodeMode") == 0)
        return true;

    return false;
}